

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_moves_32_pd(void)

{
  uint uVar1;
  uint uVar2;
  uint ea;
  uint word2;
  
  if ((m68ki_cpu.cpu_type & 0x3fc) == 0) {
    m68ki_exception_illegal();
  }
  else if (m68ki_cpu.s_flag == 0) {
    m68ki_exception_privilege_violation();
  }
  else {
    uVar1 = m68ki_read_imm_16();
    uVar2 = m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8] - 4;
    m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8] = uVar2;
    if ((uVar1 & 0x800) == 0) {
      uVar2 = m68ki_read_32_fc(uVar2,m68ki_cpu.sfc);
      m68ki_cpu.dar[uVar1 >> 0xc & 0xf] = uVar2;
      if ((m68ki_cpu.cpu_type & 0x18) != 0) {
        m68ki_remaining_cycles = m68ki_remaining_cycles + -2;
      }
    }
    else {
      m68ki_write_32_fc(uVar2,m68ki_cpu.dfc,m68ki_cpu.dar[uVar1 >> 0xc & 0xf]);
      if ((m68ki_cpu.cpu_type & 0x18) != 0) {
        m68ki_remaining_cycles = m68ki_remaining_cycles + -2;
      }
    }
  }
  return;
}

Assistant:

static void m68k_op_moves_32_pd(void)
{
	if(CPU_TYPE_IS_010_PLUS(CPU_TYPE))
	{
		if(FLAG_S)
		{
			uint word2 = OPER_I_16();
			uint ea = EA_AY_PD_32();

			m68ki_trace_t0();			   /* auto-disable (see m68kcpu.h) */
			if(BIT_B(word2))		   /* Register to memory */
			{
				m68ki_write_32_fc(ea, REG_DFC, REG_DA[(word2 >> 12) & 15]);
				if(CPU_TYPE_IS_020_VARIANT(CPU_TYPE))
					USE_CYCLES(2);
				return;
			}
			/* Memory to register */
			REG_DA[(word2 >> 12) & 15] = m68ki_read_32_fc(ea, REG_SFC);
			if(CPU_TYPE_IS_020_VARIANT(CPU_TYPE))
				USE_CYCLES(2);
			return;
		}
		m68ki_exception_privilege_violation();
		return;
	}
	m68ki_exception_illegal();
}